

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O0

void __thiscall GlobOpt::EndTrackCall(GlobOpt *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 *puVar5;
  Type *ppOVar6;
  StackSym *pSVar7;
  RegOpnd *pRVar8;
  bool local_31;
  StackSym *sym;
  uint origArgOutCount;
  Instr *instr_local;
  GlobOpt *this_local;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3a0,"(instr)","instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = OpCodeAttr::CallInstr(instr->m_opcode);
  if ((((!bVar2) && (instr->m_opcode != InlineeStart)) && (instr->m_opcode != InlineBuiltInEnd)) &&
     ((instr->m_opcode != InlineArrayPop && (instr->m_opcode != EndCallForPolymorphicInlinee)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3a2,
                       "(OpCodeAttr::CallInstr(instr->m_opcode) || instr->m_opcode == Js::OpCode::InlineeStart || instr->m_opcode == Js::OpCode::InlineBuiltInEnd || instr->m_opcode == Js::OpCode::InlineArrayPop || instr->m_opcode == Js::OpCode::EndCallForPolymorphicInlinee)"
                       ,
                       "OpCodeAttr::CallInstr(instr->m_opcode) || instr->m_opcode == Js::OpCode::InlineeStart || instr->m_opcode == Js::OpCode::InlineBuiltInEnd || instr->m_opcode == Js::OpCode::InlineArrayPop || instr->m_opcode == Js::OpCode::EndCallForPolymorphicInlinee"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if ((*(uint *)&this->field_0xf4 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3a4,"(!this->isCallHelper)","!this->isCallHelper");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Empty
                    ((this->currentBlock->globOptData).callSequence);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3a5,"(!this->currentBlock->globOptData.callSequence->Empty())",
                       "!this->currentBlock->globOptData.callSequence->Empty()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  uVar4 = (this->currentBlock->globOptData).argOutCount;
  while( true ) {
    ppOVar6 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Head
                        ((this->currentBlock->globOptData).callSequence);
    pSVar7 = IR::Opnd::GetStackSym(*ppOVar6);
    bVar2 = StackSym::HasArgSlotNum(pSVar7);
    if (!bVar2) break;
    (this->currentBlock->globOptData).argOutCount =
         (this->currentBlock->globOptData).argOutCount - 1;
    SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
              ((this->currentBlock->globOptData).callSequence,&this->alloc->super_ArenaAllocator);
  }
  ppOVar6 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Head
                      ((this->currentBlock->globOptData).callSequence);
  pRVar8 = IR::Opnd::AsRegOpnd(*ppOVar6);
  pSVar7 = Sym::AsStackSym(&pRVar8->m_sym->super_Sym);
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
            ((this->currentBlock->globOptData).callSequence,&this->alloc->super_ArenaAllocator);
  if ((*(uint *)&pSVar7->field_0x18 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3b4,"(sym->m_isSingleDef)","sym->m_isSingleDef");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (((pSVar7->field_5).m_instrDef)->m_opcode != StartCall) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3b5,"(sym->m_instrDef->m_opcode == Js::OpCode::StartCall)",
                       "sym->m_instrDef->m_opcode == Js::OpCode::StartCall");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  uVar3 = IR::Instr::GetArgOutCount((pSVar7->field_5).m_instrDef,true);
  local_31 = true;
  if (((instr->m_opcode != NewScObject) && (local_31 = true, instr->m_opcode != NewScObjArray)) &&
     (local_31 = true, instr->m_opcode != NewScObjectSpread)) {
    local_31 = instr->m_opcode == NewScObjArraySpread;
  }
  if (uVar3 != (uVar4 - (this->currentBlock->globOptData).argOutCount) + (uint)local_31) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3bc,
                       "((uint)sym->m_instrDef->GetArgOutCount( true) == origArgOutCount - this->currentBlock->globOptData.argOutCount + (instr->m_opcode == Js::OpCode::NewScObject || instr->m_opcode == Js::OpCode::NewScObjArray || instr->m_opcode == Js::OpCode::NewScObjectSpread || instr->m_opcode == Js::OpCode::NewScObjArraySpread))"
                       ,
                       "(uint)sym->m_instrDef->GetArgOutCount( true) == origArgOutCount - this->currentBlock->globOptData.argOutCount + (instr->m_opcode == Js::OpCode::NewScObject || instr->m_opcode == Js::OpCode::NewScObjArray || instr->m_opcode == Js::OpCode::NewScObjectSpread || instr->m_opcode == Js::OpCode::NewScObjArraySpread)"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  uVar4 = IR::Instr::GetArgOutCount((pSVar7->field_5).m_instrDef,true);
  (this->currentBlock->globOptData).totalOutParamCount =
       (this->currentBlock->globOptData).totalOutParamCount - uVar4;
  (this->currentBlock->globOptData).startCallCount =
       (this->currentBlock->globOptData).startCallCount - 1;
  return;
}

Assistant:

void GlobOpt::EndTrackCall(IR::Instr* instr)
{
    Assert(instr);
    Assert(OpCodeAttr::CallInstr(instr->m_opcode) || instr->m_opcode == Js::OpCode::InlineeStart || instr->m_opcode == Js::OpCode::InlineBuiltInEnd
        || instr->m_opcode == Js::OpCode::InlineArrayPop || instr->m_opcode == Js::OpCode::EndCallForPolymorphicInlinee);

    Assert(!this->isCallHelper);
    Assert(!this->currentBlock->globOptData.callSequence->Empty());


#if DBG
    uint origArgOutCount = this->currentBlock->globOptData.argOutCount;
#endif
    while (this->currentBlock->globOptData.callSequence->Head()->GetStackSym()->HasArgSlotNum())
    {
        this->currentBlock->globOptData.argOutCount--;
        this->currentBlock->globOptData.callSequence->RemoveHead(this->alloc);
    }
    StackSym * sym = this->currentBlock->globOptData.callSequence->Head()->AsRegOpnd()->m_sym->AsStackSym();
    this->currentBlock->globOptData.callSequence->RemoveHead(this->alloc);

#if DBG
    Assert(sym->m_isSingleDef);
    Assert(sym->m_instrDef->m_opcode == Js::OpCode::StartCall);

    // Number of argument set should be the same as indicated at StartCall
    // except NewScObject has an implicit arg1
    Assert((uint)sym->m_instrDef->GetArgOutCount(/*getInterpreterArgOutCount*/ true) ==
        origArgOutCount - this->currentBlock->globOptData.argOutCount +
           (instr->m_opcode == Js::OpCode::NewScObject || instr->m_opcode == Js::OpCode::NewScObjArray
           || instr->m_opcode == Js::OpCode::NewScObjectSpread || instr->m_opcode == Js::OpCode::NewScObjArraySpread));

#endif

    this->currentBlock->globOptData.totalOutParamCount -= sym->m_instrDef->GetArgOutCount(/*getInterpreterArgOutCount*/ true);
    this->currentBlock->globOptData.startCallCount--;
}